

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O3

ChangeInfo *
capnp::compiler::anon_unknown_0::fieldUpgradeList
          (ChangeInfo *__return_storage_ptr__,Builder decl,uint *nextOrdinal,bool scopeHasUnion)

{
  CapTableReader *pCVar1;
  SegmentBuilder *pSVar2;
  char *pcVar3;
  uint uVar4;
  ArrayPtr<const_char> *params_1;
  size_t __n;
  ulong uVar5;
  char *__src;
  SegmentReader *pSVar6;
  bool bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  Reader RVar12;
  Builder relativeName;
  Builder type;
  Builder elementType;
  Builder typeParams;
  PointerReader local_138;
  StructBuilder local_118;
  uint local_f0;
  StructBuilder local_e8;
  StructBuilder local_b8;
  ArrayPtr<const_char> local_88;
  StructBuilder local_78;
  ListBuilder local_48;
  
  if (*(short *)((long)decl._builder.data + 0xc) == 1) {
    __return_storage_ptr__->kind = NO_CHANGE;
    kj::heapString(&__return_storage_ptr__->description,0x42);
    pcVar3 = (char *)(__return_storage_ptr__->description).content.size_;
    if (pcVar3 != (char *)0x0) {
      pcVar3 = (__return_storage_ptr__->description).content.ptr;
    }
    __src = "Upgrade primitive list to struct list, but it had a default value.";
    __n = 0x42;
    goto LAB_0014d1e1;
  }
  local_118.data = decl._builder.pointers + 5;
  local_118.segment = decl._builder.segment;
  local_118.capTable = decl._builder.capTable;
  _::PointerBuilder::getStruct
            (&local_b8,(PointerBuilder *)&local_118,(StructSize)0x20003,(word *)0x0);
  if (*local_b8.data != 9) {
    __return_storage_ptr__->kind = NO_CHANGE;
    kj::heapString(&__return_storage_ptr__->description,0x3c);
    pcVar3 = (char *)(__return_storage_ptr__->description).content.size_;
    if (pcVar3 != (char *)0x0) {
      pcVar3 = (__return_storage_ptr__->description).content.ptr;
    }
    builtin_strncpy(pcVar3,"Upgrade primitive list to struct list, but it wasn\'t a list.",0x3c);
    return __return_storage_ptr__;
  }
  local_118.data = local_b8.pointers + 1;
  local_118.segment = local_b8.segment;
  local_118.capTable = local_b8.capTable;
  _::PointerBuilder::getStructList
            (&local_48,(PointerBuilder *)&local_118,(StructSize)0x20001,(word *)0x0);
  _::ListBuilder::getStructElement(&local_118,&local_48,0);
  local_e8.data = local_118.pointers + 1;
  local_e8.segment = local_118.segment;
  local_e8.capTable = local_118.capTable;
  _::PointerBuilder::getStruct
            (&local_78,(PointerBuilder *)&local_e8,(StructSize)0x20003,(word *)0x0);
  local_118.segment = local_78.segment;
  local_118.capTable = local_78.capTable;
  local_118.data = local_78.pointers;
  _::PointerBuilder::getStruct
            (&local_e8,(PointerBuilder *)&local_118,(StructSize)0x10001,(word *)0x0);
  _::StructBuilder::asReader(&local_e8);
  bVar7 = local_118.pointerCount == 0;
  local_138.pointer = local_118.pointers;
  if (bVar7) {
    local_138.pointer = (WirePointer *)0x0;
  }
  params_1 = (ArrayPtr<const_char> *)0x7fffffff;
  if (!bVar7) {
    params_1 = (ArrayPtr<const_char> *)(ulong)local_f0;
  }
  uVar8 = 0;
  uVar9 = 0;
  uVar10 = 0;
  uVar11 = 0;
  if (!bVar7) {
    uVar8 = local_118.segment._0_4_;
    uVar9 = local_118.segment._4_4_;
    uVar10 = local_118.capTable._0_4_;
    uVar11 = local_118.capTable._4_4_;
  }
  local_138.segment = (SegmentReader *)CONCAT44(uVar9,uVar8);
  local_138.capTable = (CapTableReader *)CONCAT44(uVar11,uVar10);
  local_138.nestingLimit = (int)params_1;
  RVar12 = _::PointerReader::getBlob<capnp::Text>(&local_138,(void *)0x0,0);
  uVar5 = RVar12.super_StringPtr.content.size_;
  pSVar2 = RVar12.super_StringPtr.content.ptr;
  if (uVar5 == 0xb) {
    if ((short)(pSVar2->super_SegmentReader).id.value != 0x6570 ||
        (pSVar2->super_SegmentReader).arena != (Arena *)0x7954746375727453) {
LAB_0014d3d9:
      uVar4 = *(uint *)((long)pSVar2 + (uVar5 - 7)) ^ 0x75727453;
      params_1 = (ArrayPtr<const_char> *)(ulong)uVar4;
      if (*(short *)((long)pSVar2 + (uVar5 - 3)) != 0x7463 || uVar4 != 0) {
LAB_0014d3f1:
        local_118.capTable = (CapTableBuilder *)(uVar5 - 1);
        local_88.ptr = "Struct";
        local_88.size_ = 6;
        local_118.segment = pSVar2;
        kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                  ((String *)&local_138,(_ *)&local_118,&local_88,params_1);
        pSVar6 = local_138.segment;
        if (local_138.capTable == (CapTableReader *)0x0) {
          pSVar6 = (SegmentReader *)0x1dcce1;
        }
        RVar12.super_StringPtr.content.size_ =
             (long)&(local_138.capTable)->_vptr_CapTableReader +
             (ulong)(local_138.capTable == (CapTableReader *)0x0);
        local_118.segment = local_e8.segment;
        local_118.capTable = local_e8.capTable;
        local_118.data = local_e8.pointers;
        RVar12.super_StringPtr.content.ptr = (char *)pSVar6;
        _::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_118,RVar12);
        pCVar1 = local_138.capTable;
        pSVar6 = local_138.segment;
        if (local_138.segment != (SegmentReader *)0x0) {
          local_138.segment = (SegmentReader *)0x0;
          local_138.capTable = (CapTableReader *)0x0;
          (**(code **)*local_138.pointer)(local_138.pointer,pSVar6,1,pCVar1,pCVar1,0);
        }
        __return_storage_ptr__->kind = COMPATIBLE;
        kj::heapString(&__return_storage_ptr__->description,0x25);
        pcVar3 = (char *)(__return_storage_ptr__->description).content.size_;
        if (pcVar3 != (char *)0x0) {
          pcVar3 = (__return_storage_ptr__->description).content.ptr;
        }
        builtin_strncpy(pcVar3,"Upgrade primitive list to struct list",0x25);
        return __return_storage_ptr__;
      }
    }
    __return_storage_ptr__->kind = NO_CHANGE;
    kj::heapString(&__return_storage_ptr__->description,0x48);
    pcVar3 = (char *)(__return_storage_ptr__->description).content.size_;
    if (pcVar3 != (char *)0x0) {
      pcVar3 = (__return_storage_ptr__->description).content.ptr;
    }
    __src = "Upgrade primitive list to struct list, but it was already a struct list.";
  }
  else {
    if (6 < uVar5) goto LAB_0014d3d9;
    if ((uVar5 != 5) || (*(int *)&(pSVar2->super_SegmentReader).arena != 0x6c6f6f42))
    goto LAB_0014d3f1;
    __return_storage_ptr__->kind = NO_CHANGE;
    kj::heapString(&__return_storage_ptr__->description,0x48);
    pcVar3 = (char *)(__return_storage_ptr__->description).content.size_;
    if (pcVar3 != (char *)0x0) {
      pcVar3 = (__return_storage_ptr__->description).content.ptr;
    }
    __src = "Upgrade primitive list to struct list, but bool lists can\'t be upgraded.";
  }
  __n = 0x48;
LAB_0014d1e1:
  memcpy(pcVar3,__src,__n);
  return __return_storage_ptr__;
}

Assistant:

static ChangeInfo fieldUpgradeList(Declaration::Builder decl, uint& nextOrdinal,
                                   bool scopeHasUnion) {
  // Upgrades a non-struct list to a struct list.

  auto field = decl.getField();
  if (field.getDefaultValue().isValue()) {
    return { NO_CHANGE, "Upgrade primitive list to struct list, but it had a default value." };
  }

  auto type = field.getType();
  if (!type.isApplication()) {
    return { NO_CHANGE, "Upgrade primitive list to struct list, but it wasn't a list." };
  }
  auto typeParams = type.getApplication().getParams();

  auto elementType = typeParams[0].getValue();
  auto relativeName = elementType.getRelativeName();
  auto nameText = relativeName.asReader().getValue();
  if (nameText == "StructType" || nameText.endsWith("Struct")) {
    return { NO_CHANGE, "Upgrade primitive list to struct list, but it was already a struct list."};
  }
  if (nameText == "Bool") {
    return { NO_CHANGE, "Upgrade primitive list to struct list, but bool lists can't be upgraded."};
  }

  relativeName.setValue(kj::str(nameText, "Struct"));
  return { COMPATIBLE, "Upgrade primitive list to struct list" };
}